

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSwitch
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *labels,Index defaultLabel)

{
  __index_type *__return_storage_ptr___00;
  Index label_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *a;
  size_type __n;
  Type *pTVar1;
  reference puVar2;
  Err *pEVar3;
  Name *pNVar4;
  Switch *expr;
  bool bVar5;
  optional<wasm::Type> labelType;
  Ok local_349;
  size_t local_348;
  char *pcStack_340;
  Err local_330;
  Err *local_310;
  Err *err_4;
  undefined1 local_300;
  undefined3 uStack_2ff;
  ChildPopper local_2f8;
  undefined1 local_2f0 [8];
  Result<wasm::Ok> _val_4;
  Switch curr;
  Err *err_3;
  Result<wasm::Name> _val_3;
  Result<wasm::Name> defaultName;
  Err local_1e8;
  Err *local_1c8;
  Err *err_2;
  Result<wasm::Type> _val_2;
  Result<wasm::Type> type;
  Err *err_1;
  Result<wasm::Name> _val_1;
  Result<wasm::Name> name;
  const_iterator cStack_f0;
  uint label;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  Type glbLabelType;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Type> _val;
  Result<wasm::Type> defaultType;
  Index defaultLabel_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *labels_local;
  IRBuilder *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
  getLabelType((Result<wasm::Type> *)__return_storage_ptr___00,this,defaultLabel);
  Result<wasm::Type>::Result
            ((Result<wasm::Type> *)local_78,(Result<wasm::Type> *)__return_storage_ptr___00);
  local_90 = Result<wasm::Type>::getErr((Result<wasm::Type> *)local_78);
  bVar5 = local_90 == (Err *)0x0;
  if (!bVar5) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::Type>::~Result((Result<wasm::Type> *)local_78);
  if (bVar5) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&glbLabelType);
    __n = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(labels);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&glbLabelType,__n);
    pTVar1 = Result<wasm::Type>::operator*
                       ((Result<wasm::Type> *)
                        ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    __range1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar1->id;
    __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(labels);
    cStack_f0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(labels);
    while (bVar5 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff10), bVar5) {
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
      label_00 = *puVar2;
      getLabelName((Result<wasm::Name> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),this,label_00,false
                  );
      Result<wasm::Name>::Result
                ((Result<wasm::Name> *)&err_1,
                 (Result<wasm::Name> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      pEVar3 = Result<wasm::Name>::getErr((Result<wasm::Name> *)&err_1);
      bVar5 = pEVar3 != (Err *)0x0;
      if (bVar5) {
        wasm::Err::Err((Err *)((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),pEVar3);
        Result<wasm::Ok>::Result
                  (__return_storage_ptr__,
                   (Err *)((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        wasm::Err::~Err((Err *)((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      }
      Result<wasm::Name>::~Result((Result<wasm::Name> *)&err_1);
      if (!bVar5) {
        pNVar4 = Result<wasm::Name>::operator*
                           ((Result<wasm::Name> *)
                            ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&glbLabelType,pNVar4);
        getLabelType((Result<wasm::Type> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),this,label_00);
        Result<wasm::Type>::Result
                  ((Result<wasm::Type> *)&err_2,
                   (Result<wasm::Type> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        local_1c8 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_2);
        bVar5 = local_1c8 != (Err *)0x0;
        if (bVar5) {
          wasm::Err::Err(&local_1e8,local_1c8);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1e8);
          wasm::Err::~Err(&local_1e8);
        }
        Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_2);
        a = __range1;
        if (!bVar5) {
          pTVar1 = Result<wasm::Type>::operator*
                             ((Result<wasm::Type> *)
                              ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          __range1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     wasm::Type::getGreatestLowerBound((Type)a,(Type)pTVar1->id);
        }
        bVar5 = bVar5 && bVar5;
        Result<wasm::Type>::~Result
                  ((Result<wasm::Type> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      }
      Result<wasm::Name>::~Result
                ((Result<wasm::Name> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      if (bVar5) goto LAB_02618920;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end1);
    }
    getLabelName((Result<wasm::Name> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),this,defaultLabel,
                 false);
    Result<wasm::Name>::Result
              ((Result<wasm::Name> *)&err_3,
               (Result<wasm::Name> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    pEVar3 = Result<wasm::Name>::getErr((Result<wasm::Name> *)&err_3);
    if (pEVar3 != (Err *)0x0) {
      wasm::Err::Err((Err *)&curr.condition,pEVar3);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&curr.condition);
      wasm::Err::~Err((Err *)&curr.condition);
    }
    Result<wasm::Name>::~Result((Result<wasm::Name> *)&err_3);
    if (pEVar3 == (Err *)0x0) {
      Switch::Switch((Switch *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                     &this->wasm->allocator);
      ChildPopper::ChildPopper(&local_2f8,this);
      std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                ((optional<wasm::Type> *)&err_4,(Type *)&__range1);
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)err_4;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_300;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = uStack_2ff;
      ChildPopper::visitSwitch
                ((Result<wasm::Ok> *)local_2f0,&local_2f8,
                 (Switch *)
                 ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),labelType);
      local_310 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_2f0);
      bVar5 = local_310 == (Err *)0x0;
      if (!bVar5) {
        wasm::Err::Err(&local_330,local_310);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_330);
        wasm::Err::~Err(&local_330);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_2f0);
      if (bVar5) {
        pNVar4 = Result<wasm::Name>::operator*
                           ((Result<wasm::Name> *)
                            ((long)&_val_3.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        local_348 = (pNVar4->super_IString).str._M_len;
        pcStack_340 = (pNVar4->super_IString).str._M_str;
        expr = Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                         (&this->builder,
                          (vector<wasm::Name,_std::allocator<wasm::Name>_> *)&glbLabelType,
                          (Name)(pNVar4->super_IString).str,curr.value,
                          (Expression *)curr.default_.super_IString.str._M_str);
        push(this,(Expression *)expr);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_349);
      }
    }
    Result<wasm::Name>::~Result
              ((Result<wasm::Name> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
LAB_02618920:
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&glbLabelType);
  }
  Result<wasm::Type>::~Result
            ((Result<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSwitch(const std::vector<Index>& labels,
                               Index defaultLabel) {
  auto defaultType = getLabelType(defaultLabel);
  CHECK_ERR(defaultType);

  std::vector<Name> names;
  names.reserve(labels.size());
  Type glbLabelType = *defaultType;
  for (auto label : labels) {
    auto name = getLabelName(label);
    CHECK_ERR(name);
    names.push_back(*name);
    auto type = getLabelType(label);
    CHECK_ERR(type);
    glbLabelType = Type::getGreatestLowerBound(glbLabelType, *type);
  }

  auto defaultName = getLabelName(defaultLabel);
  CHECK_ERR(defaultName);

  Switch curr(wasm.allocator);
  CHECK_ERR(ChildPopper{*this}.visitSwitch(&curr, glbLabelType));
  push(builder.makeSwitch(names, *defaultName, curr.condition, curr.value));
  return Ok{};
}